

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O2

maybe<pstore::command_line::option_*,_void> *
pstore::command_line::details::lookup_nearest_option
          (maybe<pstore::command_line::option_*,_void> *__return_storage_ptr__,string *arg,
          options_container *all_options)

{
  string *from;
  size_type sVar1;
  _List_node_base *p_Var2;
  ulong max_edit_distance;
  
  *(undefined8 *)__return_storage_ptr__ = 0;
  __return_storage_ptr__->storage_ = (type)0x0;
  if (arg->_M_string_length != 0) {
    p_Var2 = (_List_node_base *)all_options;
    max_edit_distance = 0xffffffffffffffff;
    while (p_Var2 = (((_List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
                       *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var2 != (_List_node_base *)all_options) {
      from = option::name_abi_cxx11_((option *)p_Var2[1]._M_next);
      sVar1 = string_distance(from,arg,max_edit_distance);
      if (sVar1 < max_edit_distance) {
        maybe<pstore::command_line::option*,void>::operator=
                  ((maybe<pstore::command_line::option*,void> *)__return_storage_ptr__,
                   (option **)(p_Var2 + 1));
        max_edit_distance = sVar1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

maybe<option *>
                lookup_nearest_option (std::string const & arg,
                                       option::options_container const & all_options) {
                    auto best_option = nothing<option *> ();
                    if (arg.empty ()) {
                        return best_option;
                    }
                    // Find the closest match.
                    auto best_distance = std::numeric_limits<std::string::size_type>::max ();
                    for (auto const & opt : all_options) {
                        auto const distance = string_distance (opt->name (), arg, best_distance);
                        if (distance < best_distance) {
                            best_option = opt;
                            best_distance = distance;
                        }
                    }
                    return best_option;
                }